

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O3

String * __thiscall LiteScript::Character::operator*=(Character *this,uint nb)

{
  uint uVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_00;
  String *pSVar2;
  String res;
  String cpy;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_68;
  String local_48;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = L'\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  String::String(&local_48,(this->str->str)._M_dataplus._M_p[this->i]);
  if (nb != 0) {
    do {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      _M_append(&local_68,local_48.str._M_dataplus._M_p,local_48.str._M_string_length);
      nb = nb - 1;
    } while (nb != 0);
  }
  this_00 = &this->str->str;
  uVar1 = this->i;
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::erase
            (this_00,(ulong)uVar1,1);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  replace(this_00,(ulong)uVar1,0,local_68._M_dataplus._M_p,local_68._M_string_length);
  pSVar2 = this->str;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_48.str._M_dataplus._M_p != &local_48.str.field_2) {
    operator_delete(local_48.str._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return pSVar2;
}

Assistant:

LiteScript::String& LiteScript::Character::operator*=(unsigned int nb) {
    String res, cpy(this->str[this->i]);
    for (unsigned int j = 0; j < nb; j++)
        res += cpy;
    this->str.Replace(this->i, res);
    return this->str;
}